

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void * arena_palloc(tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero,
                   tcache_t *tcache)

{
  cache_bin_stats_t *pcVar1;
  int iVar2;
  bool bVar3;
  szind_t sVar4;
  arena_t *arena_00;
  void *pvVar5;
  size_t __n;
  int iVar6;
  ulong uVar7;
  cache_bin_t *tbin;
  _Bool local_41;
  tsd_t *local_40;
  void *local_38;
  
  if ((0x3800 < usize) || ((0xfff < alignment && ((usize & 0xfff) != 0 || alignment != 0x1000)))) {
    if (0x40 < alignment) {
      pvVar5 = large_palloc(tsdn,arena,usize,alignment,zero);
      return pvVar5;
    }
    pvVar5 = large_malloc(tsdn,arena,usize,zero);
    return pvVar5;
  }
  if (usize < 0x1001) {
    uVar7 = (ulong)sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    sVar4 = sz_size2index_compute(usize);
    uVar7 = (ulong)sVar4;
  }
  if (tcache == (tcache_t *)0x0) {
    pvVar5 = arena_malloc_hard(tsdn,arena,usize,(szind_t)uVar7,zero);
    return pvVar5;
  }
  tbin = tcache->bins_small + uVar7;
  iVar2 = tcache->bins_small[uVar7].ncached;
  iVar6 = iVar2 + -1;
  tcache->bins_small[uVar7].ncached = iVar6;
  if ((tbin->low_water < iVar6) || (tbin->low_water = iVar6, iVar2 != 0)) {
    pvVar5 = tcache->bins_small[uVar7].avail[-iVar2];
    bVar3 = true;
  }
  else {
    tcache->bins_small[uVar7].ncached = 0;
    bVar3 = false;
    pvVar5 = (void *)0x0;
  }
  if (!bVar3) {
    local_40 = &tsdn->tsd;
    local_38 = pvVar5;
    arena_00 = arena_choose(&tsdn->tsd,arena);
    if (arena_00 == (arena_t *)0x0) {
      local_41 = false;
      pvVar5 = local_38;
    }
    else {
      pvVar5 = tcache_alloc_small_hard
                         ((tsdn_t *)local_40,arena_00,tcache,tbin,(szind_t)uVar7,&local_41);
    }
    tsdn = (tsdn_t *)local_40;
    if (local_41 == false) {
      return (void *)0x0;
    }
  }
  __n = sz_index2size_tab[uVar7];
  if (zero) {
LAB_00118388:
    iVar6 = 0;
  }
  else {
    if (opt_junk_alloc != true) {
      if (opt_zero != true) goto LAB_0011833f;
      goto LAB_00118388;
    }
    __n = bin_infos[uVar7].reg_size;
    iVar6 = 0xa5;
  }
  memset(pvVar5,iVar6,__n);
LAB_0011833f:
  pcVar1 = &tcache->bins_small[uVar7].tstats;
  pcVar1->nrequests = pcVar1->nrequests + 1;
  iVar6 = (tcache->gc_ticker).tick;
  (tcache->gc_ticker).tick = iVar6 + -1;
  if (iVar6 < 1) {
    (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
    tcache_event_hard(&tsdn->tsd,tcache);
  }
  return pvVar5;
}

Assistant:

void *
arena_palloc(tsdn_t *tsdn, arena_t *arena, size_t usize, size_t alignment,
    bool zero, tcache_t *tcache) {
	void *ret;

	if (usize <= SC_SMALL_MAXCLASS
	    && (alignment < PAGE
	    || (alignment == PAGE && (usize & PAGE_MASK) == 0))) {
		/* Small; alignment doesn't require special slab placement. */
		ret = arena_malloc(tsdn, arena, usize, sz_size2index(usize),
		    zero, tcache, true);
	} else {
		if (likely(alignment <= CACHELINE)) {
			ret = large_malloc(tsdn, arena, usize, zero);
		} else {
			ret = large_palloc(tsdn, arena, usize, alignment, zero);
		}
	}
	return ret;
}